

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

Node * mainposition(Table *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  
  switch(key->tt) {
  case 1:
    uVar2 = ~(uint)(-1L << (t->lsizenode & 0x3f)) & (key->value).b;
    break;
  default:
    uVar3 = (ulong)(uint)(key->value).b % (~(-1L << (t->lsizenode & 0x3f)) | 1U);
    goto LAB_00107a80;
  case 3:
    dVar1 = (key->value).n;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return t->node;
    }
    uVar3 = (ulong)(uint)((int)((ulong)dVar1 >> 0x20) + SUB84(dVar1,0)) %
            (~(-1L << (t->lsizenode & 0x3f)) | 1U);
    goto LAB_00107a80;
  case 4:
    uVar2 = ~(uint)(-1L << (t->lsizenode & 0x3f)) & *(uint *)((long)(key->value).gc + 0xc);
  }
  uVar3 = (ulong)(int)uVar2;
LAB_00107a80:
  return t->node + uVar3;
}

Assistant:

static Node*mainposition(const Table*t,const TValue*key){
switch(ttype(key)){
case 3:
return hashnum(t,nvalue(key));
case 4:
return hashstr(t,rawtsvalue(key));
case 1:
return hashboolean(t,bvalue(key));
case 2:
return hashpointer(t,pvalue(key));
default:
return hashpointer(t,gcvalue(key));
}
}